

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,std::function<void(std::error_code_const&)>,asio::any_io_executor>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *peer,endpoint_type *peer_endpoint,
          function<void_(const_std::error_code_&)> *handler,any_io_executor *io_ex)

{
  long *plVar1;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *this_00;
  reactor_op_cancellation *prVar2;
  undefined8 uVar3;
  ptr local_68;
  associated_cancellation_slot_t<std::function<void_(const_std::error_code_&)>_> slot;
  op_types local_44;
  per_descriptor_data *local_40;
  reactor *local_38;
  
  slot.handler_ = (cancellation_handler_base **)0x0;
  local_68.h = handler;
  plVar1 = (long *)__tls_get_addr(&PTR_0057ce40);
  if (*plVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(undefined8 *)(*plVar1 + 8);
  }
  this_00 = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
             *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar3,200,8);
  local_68.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_68.v = this_00;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  ::reactive_socket_accept_op
            (this_00,&(this->super_reactive_socket_service_base).success_ec_,
             (impl->super_base_implementation_type).socket_,
             (impl->super_base_implementation_type).state_,peer,&impl->protocol_,peer_endpoint,
             handler,io_ex);
  local_68.p = this_00;
  if ((slot.handler_ != (cancellation_handler_base **)0x0) &&
     ((peer->impl_).implementation_.super_base_implementation_type.socket_ == -1)) {
    local_38 = (this->super_reactive_socket_service_base).reactor_;
    local_40 = &(impl->super_base_implementation_type).reactor_data_;
    local_44 = read_op;
    prVar2 = cancellation_slot::
             emplace<asio::detail::reactive_socket_service_base::reactor_op_cancellation,asio::detail::epoll_reactor*,asio::detail::epoll_reactor::descriptor_state**,int&,asio::detail::epoll_reactor::op_types>
                       (&slot,&local_38,&local_40,(int *)impl,&local_44);
    ((local_68.p)->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ).super_reactor_op.cancellation_key_ = prVar2;
  }
  reactive_socket_service_base::
  start_accept_op<asio::detail::reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,asio::ip::tcp,std::function<void(std::error_code_const&)>,asio::any_io_executor>>
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,
             local_68.p,false,
             (peer->impl_).implementation_.super_base_implementation_type.socket_ != -1,io_ex,
             (enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
              *)0x0);
  local_68.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  local_68.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
                *)0x0;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  ::ptr::reset(&local_68);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler, const IoExecutor& io_ex)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    associated_cancellation_slot_t<Handler> slot
      = asio::get_associated_cancellation_slot(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler, IoExecutor> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(success_ec_, impl.socket_, impl.state_,
        peer, impl.protocol_, peer_endpoint, handler, io_ex);

    // Optionally register for per-operation cancellation.
    if (slot.is_connected() && !peer.is_open())
    {
      p.p->cancellation_key_ =
        &slot.template emplace<reactor_op_cancellation>(
            &reactor_, &impl.reactor_data_, impl.socket_, reactor::read_op);
    }

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open(), &io_ex, 0);
    p.v = p.p = 0;
  }